

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

void nghttp2_session_keep_idle_stream(nghttp2_session *session,nghttp2_stream *stream)

{
  nghttp2_stream *stream_local;
  nghttp2_session *session_local;
  
  if (session->idle_stream_tail == (nghttp2_stream *)0x0) {
    session->idle_stream_head = stream;
  }
  else {
    session->idle_stream_tail->closed_next = stream;
    stream->closed_prev = session->idle_stream_tail;
  }
  session->idle_stream_tail = stream;
  session->num_idle_streams = session->num_idle_streams + 1;
  return;
}

Assistant:

void nghttp2_session_keep_idle_stream(nghttp2_session *session,
                                      nghttp2_stream *stream) {
  DEBUGF("stream: keep idle stream(%p)=%d, state=%d\n", stream,
         stream->stream_id, stream->state);

  if (session->idle_stream_tail) {
    session->idle_stream_tail->closed_next = stream;
    stream->closed_prev = session->idle_stream_tail;
  } else {
    session->idle_stream_head = stream;
  }
  session->idle_stream_tail = stream;

  ++session->num_idle_streams;
}